

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

bool __thiscall
FIX::double_conversion::Bignum::ToHexString(Bignum *this,char *buffer,int buffer_size)

{
  Vector<unsigned_int> *this_00;
  char cVar1;
  bool bVar2;
  int i;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  long lVar6;
  char *pcVar7;
  int index;
  int i_1;
  int iVar8;
  
  bVar2 = IsClamped(this);
  if (!bVar2) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x23c,"bool FIX::double_conversion::Bignum::ToHexString(char *, int) const");
  }
  iVar4 = this->used_digits_;
  if (iVar4 == 0) {
    if (buffer_size < 2) {
      iVar4 = 0;
      goto LAB_0017f480;
    }
    buffer[0] = '0';
    buffer[1] = '\0';
  }
  else {
    iVar8 = this->exponent_;
    this_00 = &this->bigits_;
    puVar5 = Vector<unsigned_int>::operator[](this_00,iVar4 + -1);
    uVar3 = *puVar5;
    if (uVar3 == 0) {
      __assert_fail("number > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                    ,0x22a,"int FIX::double_conversion::SizeInHexChars(S) [S = unsigned int]");
    }
    iVar8 = (iVar8 + iVar4) * 7 + -8;
    for (; uVar3 != 0; uVar3 = uVar3 >> 4) {
      iVar8 = iVar8 + 1;
    }
    iVar4 = 0;
    if (buffer_size <= iVar8 + 1) goto LAB_0017f480;
    buffer[iVar8 + 1] = '\0';
    for (; iVar4 < this->exponent_; iVar4 = iVar4 + 1) {
      for (lVar6 = 0; (int)lVar6 != -7; lVar6 = lVar6 + -1) {
        buffer[lVar6 + iVar8] = '0';
      }
      iVar8 = iVar8 + -7;
    }
    iVar4 = 0;
    while( true ) {
      index = this->used_digits_ + -1;
      if (index <= iVar4) break;
      puVar5 = Vector<unsigned_int>::operator[](this_00,iVar4);
      uVar3 = *puVar5;
      for (lVar6 = 0; (int)lVar6 != -7; lVar6 = lVar6 + -1) {
        cVar1 = '7';
        if ((uVar3 & 0xf) < 10) {
          cVar1 = '0';
        }
        buffer[lVar6 + iVar8] = cVar1 + (char)(uVar3 & 0xf);
        uVar3 = uVar3 >> 4;
      }
      iVar8 = iVar8 + -7;
      iVar4 = iVar4 + 1;
    }
    puVar5 = Vector<unsigned_int>::operator[](this_00,index);
    pcVar7 = buffer + iVar8;
    for (uVar3 = *puVar5; uVar3 != 0; uVar3 = uVar3 >> 4) {
      cVar1 = '7';
      if ((uVar3 & 0xf) < 10) {
        cVar1 = '0';
      }
      *pcVar7 = cVar1 + (char)(uVar3 & 0xf);
      pcVar7 = pcVar7 + -1;
    }
  }
  iVar4 = 1;
LAB_0017f480:
  return SUB41(iVar4,0);
}

Assistant:

bool Bignum::ToHexString(char* buffer, int buffer_size) const {
  ASSERT(IsClamped());
  // Each bigit must be printable as separate hex-character.
  ASSERT(kBigitSize % 4 == 0);
  const int kHexCharsPerBigit = kBigitSize / 4;

  if (used_digits_ == 0) {
    if (buffer_size < 2) return false;
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  // We add 1 for the terminating '\0' character.
  int needed_chars = (BigitLength() - 1) * kHexCharsPerBigit +
      SizeInHexChars(bigits_[used_digits_ - 1]) + 1;
  if (needed_chars > buffer_size) return false;
  int string_index = needed_chars - 1;
  buffer[string_index--] = '\0';
  for (int i = 0; i < exponent_; ++i) {
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = '0';
    }
  }
  for (int i = 0; i < used_digits_ - 1; ++i) {
    Chunk current_bigit = bigits_[i];
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = HexCharOfValue(current_bigit & 0xF);
      current_bigit >>= 4;
    }
  }
  // And finally the last bigit.
  Chunk most_significant_bigit = bigits_[used_digits_ - 1];
  while (most_significant_bigit != 0) {
    buffer[string_index--] = HexCharOfValue(most_significant_bigit & 0xF);
    most_significant_bigit >>= 4;
  }
  return true;
}